

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandLines.cxx
# Opt level: O2

cmCustomCommandLine *
cmMakeCommandLine(cmCustomCommandLine *__return_storage_ptr__,
                 initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist)

{
  size_t *psVar1;
  long lVar2;
  string_view cmd;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&__return_storage_ptr__->
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ,ilist._M_len);
  for (lVar2 = 0; ilist._M_len << 4 != lVar2; lVar2 = lVar2 + 0x10) {
    psVar1 = (size_t *)((long)&(ilist._M_array)->_M_len + lVar2);
    local_38._M_len = *psVar1;
    local_38._M_str = (char *)psVar1[1];
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

cmCustomCommandLine cmMakeCommandLine(
  std::initializer_list<cm::string_view> ilist)
{
  cmCustomCommandLine commandLine;
  commandLine.reserve(ilist.size());
  for (cm::string_view cmd : ilist) {
    commandLine.emplace_back(cmd);
  }
  return commandLine;
}